

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void move_suite::move_boolean(void)

{
  undefined1 *this;
  undefined1 local_7f;
  undefined1 local_7e [19];
  undefined1 local_6b;
  undefined1 local_6a [2];
  undefined1 local_68 [8];
  variable copy;
  variable data;
  
  this = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)this,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68,
             (basic_variable<std::allocator<char>_> *)this);
  local_6a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_68);
  local_6b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x715,"void move_suite::move_boolean()",local_6a,&local_6b);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_68);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x716,"void move_suite::move_boolean()",local_7e,&local_7f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  return;
}

Assistant:

void move_boolean()
{
    variable data(true);
    variable copy(std::move(data));
    TRIAL_PROTOCOL_TEST_EQUAL(copy.is<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(copy.value<bool>(), true);
}